

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

UGroup * re2::LookupGroup(StringPiece *name,UGroup *groups,int ngroups)

{
  char *__s2;
  size_t sVar1;
  char *__s;
  int iVar2;
  size_t __n;
  long lVar3;
  ulong uVar4;
  UGroup *pUVar5;
  
  if (0 < ngroups) {
    __s2 = name->data_;
    sVar1 = name->size_;
    uVar4 = (ulong)(uint)ngroups;
    lVar3 = 0;
    pUVar5 = groups;
    do {
      __s = pUVar5->name;
      if (__s == (char *)0x0) {
        __n = 0;
      }
      else {
        __n = strlen(__s);
      }
      if (__n == sVar1) {
        if (__n == 0) {
          return pUVar5;
        }
        if (__s == __s2) {
          return pUVar5;
        }
        iVar2 = bcmp(__s,__s2,__n);
        if (iVar2 == 0) {
          return groups + lVar3;
        }
      }
      lVar3 = lVar3 + 1;
      pUVar5 = pUVar5 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return (UGroup *)0x0;
}

Assistant:

static const UGroup* LookupGroup(const StringPiece& name,
                                 const UGroup *groups, int ngroups) {
  // Simple name lookup.
  for (int i = 0; i < ngroups; i++)
    if (StringPiece(groups[i].name) == name)
      return &groups[i];
  return NULL;
}